

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

bool __thiscall
MetaCommand::SetOptionRange
          (MetaCommand *this,string *optionName,string *name,string *rangeMin,string *rangeMax)

{
  pointer pOVar1;
  __type _Var2;
  pointer __lhs;
  pointer __lhs_00;
  
  __lhs_00 = (this->m_OptionVector).
             super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    pOVar1 = (this->m_OptionVector).
             super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__lhs_00 == pOVar1) {
LAB_00116383:
      return __lhs_00 != pOVar1;
    }
    _Var2 = std::operator==(&__lhs_00->name,optionName);
    if (_Var2) {
      for (__lhs = (__lhs_00->fields).
                   super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          __lhs != (__lhs_00->fields).
                   super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
        _Var2 = std::operator==(&__lhs->name,name);
        if (_Var2) {
          std::__cxx11::string::_M_assign((string *)&__lhs->rangeMin);
          std::__cxx11::string::_M_assign((string *)&__lhs->rangeMax);
          goto LAB_00116383;
        }
      }
    }
    __lhs_00 = __lhs_00 + 1;
  } while( true );
}

Assistant:

bool MetaCommand::SetOptionRange(METAIO_STL::string optionName,
                                 METAIO_STL::string name,
                                 METAIO_STL::string rangeMin,
                                 METAIO_STL::string rangeMax)
{
  auto it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      METAIO_STL::vector<Field> & fields = (*it).fields;
      auto itField = fields.begin();
      while(itField != fields.end())
        {
        if((*itField).name == name)
          {
          (*itField).rangeMin = rangeMin;
          (*itField).rangeMax = rangeMax;
          return true;
          }
        ++itField;
        }
      }
    ++it;
    }
  return false;
}